

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridAxisIrregular::~GridAxisIrregular(GridAxisIrregular *this)

{
  GridAxisIrregular *this_local;
  
  ~GridAxisIrregular(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

GridAxisIrregular::~GridAxisIrregular()
{
}